

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

void __thiscall
icu_63::CalendarAstronomer::CalendarAstronomer
          (CalendarAstronomer *this,double longitude,double latitude)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  UDate UVar5;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  
  UVar5 = Calendar::getNow();
  this->fTime = UVar5;
  dVar6 = longitude * 0.017453292519943295 + 3.141592653589793;
  (this->moonPosition).ascension = 0.0;
  (this->moonPosition).declination = 0.0;
  this->moonPositionSet = '\0';
  dVar7 = uprv_floor_63(dVar6 / 6.283185307179586);
  this->fLongitude = dVar7 * -6.283185307179586 + dVar6 + -3.141592653589793;
  dVar6 = latitude * 0.017453292519943295 + 3.141592653589793;
  dVar7 = uprv_floor_63(dVar6 / 6.283185307179586);
  this->fLatitude = dVar7 * -6.283185307179586 + dVar6 + -3.141592653589793;
  this->fGmtOffset = (this->fLongitude * 24.0 * 3600000.0) / 6.283185307179586;
  dVar6 = uprv_getNaN_63();
  uVar8 = SUB84(dVar6,0);
  uVar9 = (undefined4)((ulong)dVar6 >> 0x20);
  auVar1._8_4_ = uVar8;
  auVar1._0_8_ = dVar6;
  auVar1._12_4_ = uVar9;
  this->sunLongitude = dVar6;
  this->meanAnomalySun = (double)auVar1._8_8_;
  auVar2._8_4_ = uVar8;
  auVar2._0_8_ = dVar6;
  auVar2._12_4_ = uVar9;
  this->julianDay = dVar6;
  this->julianCentury = (double)auVar2._8_8_;
  auVar3._8_4_ = uVar8;
  auVar3._0_8_ = dVar6;
  auVar3._12_4_ = uVar9;
  this->meanAnomalyMoon = dVar6;
  this->eclipObliquity = (double)auVar3._8_8_;
  auVar4._8_4_ = uVar8;
  auVar4._0_8_ = dVar6;
  auVar4._12_4_ = uVar9;
  this->moonLongitude = dVar6;
  this->moonEclipLong = (double)auVar4._8_8_;
  this->siderealTime = dVar6;
  this->siderealT0 = dVar6;
  this->moonPositionSet = '\0';
  return;
}

Assistant:

CalendarAstronomer::CalendarAstronomer(double longitude, double latitude) :
  fTime(Calendar::getNow()), moonPosition(0,0), moonPositionSet(FALSE) {
  fLongitude = normPI(longitude * (double)DEG_RAD);
  fLatitude  = normPI(latitude  * (double)DEG_RAD);
  fGmtOffset = (double)(fLongitude * 24. * (double)HOUR_MS / (double)CalendarAstronomer_PI2);
  clearCache();
}